

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add127_test.cc
# Opt level: O3

void intgemm::anon_unknown_0::TestMultiplyBiasNew<intgemm::AVX512VNNI::Kernels8>
               (Index A_rows,Index width,Index B_cols,float int_tolerance,float float_tolerance,
               float MSE_float_tolerance,float MSE_int_tolerance)

{
  ulong uVar1;
  UnquantizeAndAddBiasAndWrite callback;
  UnquantizeAndAddBiasAndWrite callback_00;
  size_t __i;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  float *pfVar6;
  char *pcVar7;
  float *pfVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  float *pfVar12;
  ulong size;
  int iVar13;
  long lVar14;
  float fVar15;
  AlignedVector<float> B;
  AlignedVector<float> A;
  AlignedVector<float> bias;
  AlignedVector<float> test_C;
  AlignedVector<signed_char> B_prep;
  AlignedVector<float> float_C;
  AlignedVector<signed_char> A_prep2;
  AlignedVector<float> slowint_C;
  AlignedVector<signed_char> B_quant;
  AlignedVector<unsigned_char> A_prep;
  ostringstream info;
  mt19937 gen;
  AlignedVector<float> local_1638;
  AlignedVector<float> local_1628;
  AlignedVector<float> local_1618;
  AlignedVector<float> local_1608;
  float local_15f8;
  float local_15f4;
  ulong local_15f0;
  AlignedVector<signed_char> local_15e8;
  AlignedVector<float> local_15d8;
  AlignedVector<signed_char> local_15c8;
  AlignedVector<float> local_15b8;
  AlignedVector<signed_char> local_15a8;
  AlignedVector<unsigned_char> local_1598;
  float *local_1588;
  undefined4 local_1580;
  undefined4 uStack_157c;
  float *pfStack_1578;
  float *local_1570;
  undefined4 local_1568;
  undefined4 uStack_1564;
  float *pfStack_1560;
  float *local_1558;
  string local_1550;
  ostringstream local_1530 [112];
  ios_base local_14c0 [264];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  uVar1 = (ulong)width;
  local_15f8 = int_tolerance;
  local_15f4 = float_tolerance;
  std::__cxx11::ostringstream::ostringstream(local_1530);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1530,"8-bit AVX512VNNI",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1530,"\t",1);
  local_15f0 = (ulong)A_rows;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1530);
  local_13b8._M_x[0]._0_1_ = 9;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_13b8,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_13b8._M_x[0]._0_1_ = 9;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_13b8,1);
  size = (ulong)B_cols;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_13b8._M_x[0] = CONCAT71(local_13b8._M_x[0]._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_13b8,1);
  AlignedVector<float>::AlignedVector(&local_1628,(ulong)(width * A_rows),0x40);
  AlignedVector<float>::AlignedVector(&local_1638,(ulong)(B_cols * width),0x40);
  AlignedVector<float>::AlignedVector(&local_1618,size,0x40);
  pfVar6 = local_1628.mem_;
  local_13b8._M_x[0] = 0x1571;
  lVar3 = 1;
  uVar5 = 0x1571;
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar3);
    local_13b8._M_x[lVar3] = uVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_13b8._M_p = 0x270;
  if (local_1628.size_ != 0) {
    lVar3 = local_1628.size_ << 2;
    lVar14 = 0;
    do {
      fVar15 = std::
               generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         (&local_13b8);
      *(float *)((long)pfVar6 + lVar14) = fVar15 + fVar15 + -1.0;
      lVar14 = lVar14 + 4;
    } while (lVar3 != lVar14);
  }
  pfVar6 = local_1638.mem_;
  lVar3 = CONCAT44(local_1638.size_._4_4_,(Index)local_1638.size_);
  if (lVar3 != 0) {
    lVar14 = 0;
    do {
      fVar15 = std::
               generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         (&local_13b8);
      *(float *)((long)pfVar6 + lVar14) = fVar15 + fVar15 + -1.0;
      lVar14 = lVar14 + 4;
    } while (lVar3 << 2 != lVar14);
  }
  pfVar6 = local_1618.mem_;
  if (local_1618.size_ != 0) {
    lVar3 = 0;
    do {
      fVar15 = std::
               generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         (&local_13b8);
      *(float *)((long)pfVar6 + lVar3) = fVar15 + fVar15 + -1.0;
      lVar3 = lVar3 + 4;
    } while (local_1618.size_ << 2 != lVar3);
  }
  AlignedVector<unsigned_char>::AlignedVector(&local_1598,local_1628.size_,0x40);
  AlignedVector<signed_char>::AlignedVector
            (&local_15e8,CONCAT44(local_1638.size_._4_4_,(Index)local_1638.size_),0x40);
  AVX512BW::Kernels8::PrepareA(local_1628.mem_,local_1598.mem_,63.5,A_rows,width);
  AVX512BW::Kernels8::PrepareB(local_1638.mem_,local_15e8.mem_,63.5,width,B_cols);
  AlignedVector<float>::AlignedVector(&local_1608,(ulong)(B_cols * A_rows),0x40);
  AlignedVector<signed_char>::AlignedVector
            (&local_15a8,CONCAT44(local_1638.size_._4_4_,(Index)local_1638.size_),0x40);
  AVX512BW::Kernels8::Quantize(local_1638.mem_,local_15a8.mem_,63.5,(Index)local_1638.size_);
  AlignedVector<float>::AlignedVector(&local_15b8,local_1608.size_,0x40);
  AlignedVector<signed_char>::AlignedVector(&local_15c8,local_1628.size_,0x40);
  AVX512BW::Kernels8::PrepareA(local_1628.mem_,local_15c8.mem_,63.5,A_rows,width);
  if (A_rows != 0) {
    local_1588 = local_15b8.mem_;
    uVar5 = 0;
    pcVar4 = local_15c8.mem_;
    do {
      if (B_cols != 0) {
        uVar10 = 0;
        pcVar9 = local_15a8.mem_;
        do {
          if (width == 0) {
            fVar15 = 0.0;
          }
          else {
            uVar11 = 0;
            iVar13 = 0;
            pcVar7 = pcVar9;
            do {
              iVar13 = iVar13 + (int)*pcVar7 * (int)pcVar4[uVar11];
              uVar11 = uVar11 + 1;
              pcVar7 = pcVar7 + size;
            } while (uVar1 != uVar11);
            fVar15 = (float)iVar13;
          }
          local_15b8.mem_[uVar5 * size + uVar10] = fVar15 * 0.0002480005 + local_1618.mem_[uVar10];
          uVar10 = uVar10 + 1;
          pcVar9 = pcVar9 + 1;
        } while (uVar10 != size);
      }
      uVar5 = uVar5 + 1;
      pcVar4 = pcVar4 + uVar1;
    } while (uVar5 != local_15f0);
  }
  AlignedVector<float>::AlignedVector(&local_15d8,local_1608.size_,0x40);
  if (A_rows != 0) {
    uVar5 = 0;
    pfVar6 = local_1628.mem_;
    do {
      if (B_cols != 0) {
        uVar10 = 0;
        pfVar12 = local_1638.mem_;
        do {
          if (width == 0) {
            fVar15 = 0.0;
          }
          else {
            fVar15 = 0.0;
            uVar11 = 0;
            pfVar8 = pfVar12;
            do {
              fVar15 = fVar15 + *pfVar8 * pfVar6[uVar11];
              uVar11 = uVar11 + 1;
              pfVar8 = pfVar8 + size;
            } while (uVar1 != uVar11);
          }
          local_15d8.mem_[uVar5 * size + uVar10] = fVar15 + local_1618.mem_[uVar10];
          uVar10 = uVar10 + 1;
          pfVar12 = pfVar12 + 1;
        } while (uVar10 != size);
      }
      uVar5 = uVar5 + 1;
      pfVar6 = pfVar6 + uVar1;
    } while (uVar5 != local_15f0);
  }
  local_1568 = 0xbd010204;
  pfStack_1560 = local_1618.mem_;
  local_1558 = local_1618.mem_;
  callback._4_4_ = uStack_1564;
  callback.unquant_mult = -0.031496063;
  callback.bias_addr = local_1618.mem_;
  callback.output_addr = local_1618.mem_;
  AVX512VNNI::Kernels8::PrepareBias<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (local_15e8.mem_,width,B_cols,callback);
  local_1580 = 0x39820610;
  pfStack_1578 = local_1618.mem_;
  local_1570 = local_1608.mem_;
  callback_00._4_4_ = uStack_157c;
  callback_00.unquant_mult = 0.0002480005;
  callback_00.bias_addr = local_1618.mem_;
  callback_00.output_addr = local_1608.mem_;
  AVX512VNNI::Kernels8::Multiply8Shift<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (local_1598.mem_,local_15e8.mem_,A_rows,width,B_cols,callback_00);
  pfVar8 = local_15b8.mem_;
  pfVar12 = local_15d8.mem_;
  pfVar6 = local_1608.mem_;
  std::__cxx11::stringbuf::str();
  CompareMSE(pfVar12,pfVar8,pfVar6,local_1608.size_,&local_1550,0.0001,local_15f8,local_15f4,0.001);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1550._M_dataplus._M_p != &local_1550.field_2) {
    operator_delete(local_1550._M_dataplus._M_p);
  }
  free(local_15d8.mem_);
  free(local_15c8.mem_);
  free(local_15b8.mem_);
  free(local_15a8.mem_);
  free(local_1608.mem_);
  free(local_15e8.mem_);
  free(local_1598.mem_);
  free(local_1618.mem_);
  free(local_1638.mem_);
  free(local_1628.mem_);
  std::__cxx11::ostringstream::~ostringstream(local_1530);
  std::ios_base::~ios_base(local_14c0);
  return;
}

Assistant:

void TestMultiplyBiasNew(Index A_rows, Index width, Index B_cols,
 float int_tolerance=.1, float float_tolerance=1, float MSE_float_tolerance=0, float MSE_int_tolerance=0) {
  std::ostringstream info;
  info << Routine::kName << "\t" << A_rows << '\t' << width << '\t' << B_cols << '\n';

  // Initialize A and B.
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = dist(gen);
  }

  float alpha = 2.0f;
  float quant_mult = 127.0f / alpha;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<uint8_t> A_prep(A.size());
  AlignedVector<int8_t> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  /*REFERENCE MULTIPLICATION
  *
  *
  */
  AlignedVector<int8_t> B_quant(B.size());
  Routine::Quantize(B.begin(), B_quant.begin(), quant_mult, static_cast<Index>(B.size()));
  AlignedVector<float> slowint_C(test_C.size());
  // Taking the original A_preparation which means A would be int8_t
  AlignedVector<int8_t> A_prep2(A.size());
  Routine::PrepareA(A.begin(), A_prep2.begin(), quant_mult, A_rows, width);
  references::Multiply(A_prep2.begin(), B_quant.begin(), slowint_C.begin(), A_rows, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
    return sum * unquant_mult + bias[info.col_idx];
  });

  AlignedVector<float> float_C(test_C.size());
  references::Multiply(A.begin(), B.begin(), float_C.begin(), A_rows, width, B_cols, [&](double sum, const callbacks::OutputBufferInfo& info) {
    return static_cast<float>(sum) + bias[info.col_idx];
  });

  /*ACTUAL MULTIPLICATION
  *
  */
  float unquant_mult_forprep = (-1.0f)*(alpha)*(alpha)/(127.0f); //Minus one to invert add_ps later on
  Routine::PrepareBias(B_prep.begin(), width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult_forprep, bias.begin(), bias.begin()));
  //Routine::PrepareBias(B.begin(), bias.begin(), alpha, width, B_cols);
  Routine::Multiply8Shift(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), test_C.begin()));

  CompareMSE(float_C.begin(), slowint_C.begin(), test_C.begin(), test_C.size(), info.str(),
   int_tolerance, float_tolerance, MSE_float_tolerance, MSE_int_tolerance);
}